

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::ParameterValueAssignmentSyntax::ParameterValueAssignmentSyntax
          (ParameterValueAssignmentSyntax *this,Token hash,Token openParen,
          SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *parameters,Token closeParen)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar6 = hash._0_8_;
  uVar5 = openParen._0_8_;
  (this->super_SyntaxNode).kind = ParameterValueAssignment;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (this->hash).kind = (short)uVar6;
  (this->hash).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->hash).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->hash).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->hash).info = hash.info;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  uVar3 = *(undefined4 *)&(parameters->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (parameters->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->parameters).super_SyntaxListBase.super_SyntaxNode.kind =
       (parameters->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->parameters).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->parameters).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->parameters).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (parameters->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->parameters).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (this->parameters).super_SyntaxListBase.childCount = (parameters->super_SyntaxListBase).childCount
  ;
  (this->parameters).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0062f460;
  sVar2 = (parameters->elements)._M_extent._M_extent_value;
  (this->parameters).elements._M_ptr = (parameters->elements)._M_ptr;
  (this->parameters).elements._M_extent._M_extent_value = sVar2;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  (this->parameters).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar7 = (this->parameters).elements._M_extent._M_extent_value + 1;
  if (1 < uVar7) {
    uVar7 = uVar7 >> 1;
    lVar8 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->parameters).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      (*ppSVar4)->parent = &this->super_SyntaxNode;
      lVar8 = lVar8 + 0x30;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

ArgumentSyntax(SyntaxKind kind) :
        SyntaxNode(kind) {
    }